

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPIRVShaderResources.cpp
# Opt level: O1

void Diligent::LoadShaderCodeVariableDesc
               (Compiler *Compiler,TypeID *TypeID,Bitset *Decoration,bool IsHLSLSource,
               ShaderCodeVariableDescX *TypeDesc)

{
  vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
  *this;
  Uint8 UVar1;
  BaseType BVar2;
  pointer pcVar3;
  char *pcVar4;
  pointer pSVar5;
  pointer pSVar6;
  pointer pSVar7;
  TypedID<(diligent_spirv_cross::Types)1> *pTVar8;
  SHADER_CODE_BASIC_TYPE SVar9;
  uchar uVar10;
  uint uVar11;
  uint32_t uVar12;
  SPIRType *type;
  string *psVar13;
  Bitset *Decoration_00;
  char (*Args_1) [9];
  uint32_t index;
  ulong uVar14;
  string msg;
  string msg_1;
  undefined1 local_c8 [20];
  uint32_t uStack_b4;
  undefined8 uStack_b0;
  ShaderCodeVariableDesc *local_a8;
  ShaderCodeVariableDescX *local_98;
  string local_90;
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  type = diligent_spirv_cross::Compiler::get_type(Compiler,(TypeID)TypeID->id);
  BVar2 = type->basetype;
  if ((ulong)BVar2 == 0xf) {
    (TypeDesc->super_ShaderCodeVariableDesc).Class = SHADER_CODE_VARIABLE_CLASS_STRUCT;
  }
  else if ((type->vecsize < 2) || (type->columns < 2)) {
    if (type->vecsize < 2) {
      (TypeDesc->super_ShaderCodeVariableDesc).Class = SHADER_CODE_VARIABLE_CLASS_SCALAR;
    }
    else {
      (TypeDesc->super_ShaderCodeVariableDesc).Class = SHADER_CODE_VARIABLE_CLASS_VECTOR;
    }
  }
  else if ((Decoration->lower & 0x10) == 0) {
    (TypeDesc->super_ShaderCodeVariableDesc).Class =
         SHADER_CODE_VARIABLE_CLASS_MATRIX_COLUMNS - IsHLSLSource;
  }
  else {
    (TypeDesc->super_ShaderCodeVariableDesc).Class =
         IsHLSLSource + SHADER_CODE_VARIABLE_CLASS_MATRIX_ROWS;
  }
  if ((TypeDesc->super_ShaderCodeVariableDesc).Class != SHADER_CODE_VARIABLE_CLASS_STRUCT) {
    if (BVar2 < ControlPointArray) {
      SVar9 = (&DAT_006e8098)[BVar2];
    }
    else {
      FormatString<char[24]>((string *)local_c8,(char (*) [24])"Unknown SPIRV base type");
      DebugAssertionFailed
                ((Char *)local_c8._0_8_,"SpirvBaseTypeToShaderCodeBasicType",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
                 ,0x124);
      if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
        operator_delete((void *)local_c8._0_8_,stack0xffffffffffffff48 + 1);
      }
      SVar9 = SHADER_CODE_BASIC_TYPE_UNKNOWN;
    }
    (TypeDesc->super_ShaderCodeVariableDesc).BasicType = SVar9;
    uVar10 = StaticCast<unsigned_char,unsigned_int>(&type->vecsize);
    (TypeDesc->super_ShaderCodeVariableDesc).NumRows = uVar10;
    uVar10 = StaticCast<unsigned_char,unsigned_int>(&type->columns);
    (TypeDesc->super_ShaderCodeVariableDesc).NumColumns = uVar10;
    if (IsHLSLSource) {
      UVar1 = (TypeDesc->super_ShaderCodeVariableDesc).NumRows;
      (TypeDesc->super_ShaderCodeVariableDesc).NumRows = uVar10;
      (TypeDesc->super_ShaderCodeVariableDesc).NumColumns = UVar1;
    }
  }
  psVar13 = diligent_spirv_cross::Compiler::get_name_abi_cxx11_(Compiler,(ID)TypeID->id);
  pcVar3 = (psVar13->_M_dataplus)._M_p;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar3,pcVar3 + psVar13->_M_string_length);
  std::__cxx11::string::operator=((string *)&TypeDesc->TypeNameCopy,(string *)local_50);
  (TypeDesc->super_ShaderCodeVariableDesc).TypeName = (TypeDesc->TypeNameCopy)._M_dataplus._M_p;
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  pcVar4 = (TypeDesc->super_ShaderCodeVariableDesc).TypeName;
  if ((pcVar4 == (char *)0x0) || (*pcVar4 == '\0')) {
    psVar13 = diligent_spirv_cross::Compiler::get_name_abi_cxx11_
                        (Compiler,(ID)(type->parent_type).id);
    pcVar3 = (psVar13->_M_dataplus)._M_p;
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_70,pcVar3,pcVar3 + psVar13->_M_string_length);
    std::__cxx11::string::operator=((string *)&TypeDesc->TypeNameCopy,(string *)local_70);
    (TypeDesc->super_ShaderCodeVariableDesc).TypeName = (TypeDesc->TypeNameCopy)._M_dataplus._M_p;
    if (local_70[0] != local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
    }
  }
  pcVar4 = (TypeDesc->super_ShaderCodeVariableDesc).TypeName;
  if ((pcVar4 == (char *)0x0) || (*pcVar4 == '\0')) {
    ShaderCodeVariableDescX::SetDefaultTypeName(TypeDesc,SHADER_SOURCE_LANGUAGE_GLSL - IsHLSLSource)
    ;
  }
  if ((type->array).super_VectorView<unsigned_int>.buffer_size == 0) {
    uVar11 = 0;
  }
  else {
    uVar11 = *(type->array).super_VectorView<unsigned_int>.ptr;
  }
  (TypeDesc->super_ShaderCodeVariableDesc).ArraySize = uVar11;
  if ((type->member_types).
      super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>.buffer_size
      != 0) {
    this = &TypeDesc->Members;
    uVar14 = 0;
    local_98 = TypeDesc;
    do {
      stack0xffffffffffffff48 = 0;
      uStack_b0 = 0;
      local_c8._0_8_ = (pointer)0x0;
      local_c8._8_8_ = (char *)0x0;
      local_a8 = (ShaderCodeVariableDesc *)0x0;
      index = (uint32_t)uVar14;
      psVar13 = diligent_spirv_cross::Compiler::get_member_name_abi_cxx11_
                          (Compiler,(TypeID)TypeID->id,index);
      local_c8._0_8_ = (psVar13->_M_dataplus)._M_p;
      if (*(char *)local_c8._0_8_ == '\0') {
        psVar13 = diligent_spirv_cross::Compiler::get_member_name_abi_cxx11_
                            (Compiler,(TypeID)(type->parent_type).id,index);
        local_c8._0_8_ = (psVar13->_M_dataplus)._M_p;
      }
      uVar12 = diligent_spirv_cross::Compiler::type_struct_member_offset(Compiler,type,index);
      uStack_b4 = uVar12;
      pSVar5 = (TypeDesc->Members).
               super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pSVar6 = (TypeDesc->Members).
               super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
               ._M_impl.super__Vector_impl_data._M_start;
      std::
      vector<Diligent::ShaderCodeVariableDescX,std::allocator<Diligent::ShaderCodeVariableDescX>>::
      emplace_back<Diligent::ShaderCodeVariableDesc_const&>
                ((vector<Diligent::ShaderCodeVariableDescX,std::allocator<Diligent::ShaderCodeVariableDescX>>
                  *)this,(ShaderCodeVariableDesc *)local_c8);
      pSVar7 = (TypeDesc->Members).
               super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
               ._M_impl.super__Vector_impl_data._M_start;
      Args_1 = (char (*) [9])
               ((ulong)((long)(TypeDesc->Members).
                              super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar7) >> 7);
      (TypeDesc->super_ShaderCodeVariableDesc).NumMembers = (Uint32)Args_1;
      (TypeDesc->super_ShaderCodeVariableDesc).pMembers = &pSVar7->super_ShaderCodeVariableDesc;
      if ((long)pSVar5 - (long)pSVar6 >> 7 != uVar14) {
        FormatString<char[26],char[9]>
                  (&local_90,(Diligent *)"Debug expression failed:\n",(char (*) [26])"idx == i",
                   Args_1);
        DebugAssertionFailed
                  (local_90._M_dataplus._M_p,"LoadShaderCodeVariableDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
                   ,0x15f);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
      }
      pTVar8 = (type->member_types).
               super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>.ptr;
      Decoration_00 =
           diligent_spirv_cross::Compiler::get_member_decoration_bitset
                     (Compiler,(TypeID)TypeID->id,index);
      TypeDesc = local_98;
      LoadShaderCodeVariableDesc
                (Compiler,pTVar8 + uVar14,Decoration_00,IsHLSLSource,
                 (this->
                 super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
                 )._M_impl.super__Vector_impl_data._M_start + uVar14);
      uVar14 = (ulong)(index + 1);
    } while (uVar14 < (type->member_types).
                      super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>
                      .buffer_size);
  }
  return;
}

Assistant:

void LoadShaderCodeVariableDesc(const diligent_spirv_cross::Compiler& Compiler,
                                const diligent_spirv_cross::TypeID&   TypeID,
                                const diligent_spirv_cross::Bitset&   Decoration,
                                bool                                  IsHLSLSource,
                                ShaderCodeVariableDescX&              TypeDesc)
{
    const auto& SpvType = Compiler.get_type(TypeID);
    if (SpvType.basetype == diligent_spirv_cross::SPIRType::Struct)
    {
        TypeDesc.Class = SHADER_CODE_VARIABLE_CLASS_STRUCT;
    }
    else if (SpvType.vecsize > 1 && SpvType.columns > 1)
    {
        if (Decoration.get(spv::Decoration::DecorationRowMajor))
            TypeDesc.Class = IsHLSLSource ? SHADER_CODE_VARIABLE_CLASS_MATRIX_COLUMNS : SHADER_CODE_VARIABLE_CLASS_MATRIX_ROWS;
        else
            TypeDesc.Class = IsHLSLSource ? SHADER_CODE_VARIABLE_CLASS_MATRIX_ROWS : SHADER_CODE_VARIABLE_CLASS_MATRIX_COLUMNS;
    }
    else if (SpvType.vecsize > 1)
    {
        TypeDesc.Class = SHADER_CODE_VARIABLE_CLASS_VECTOR;
    }
    else
    {
        TypeDesc.Class = SHADER_CODE_VARIABLE_CLASS_SCALAR;
    }

    if (TypeDesc.Class != SHADER_CODE_VARIABLE_CLASS_STRUCT)
    {
        TypeDesc.BasicType  = SpirvBaseTypeToShaderCodeBasicType(SpvType.basetype);
        TypeDesc.NumRows    = StaticCast<decltype(TypeDesc.NumRows)>(SpvType.vecsize);
        TypeDesc.NumColumns = StaticCast<decltype(TypeDesc.NumColumns)>(SpvType.columns);
        if (IsHLSLSource)
            std::swap(TypeDesc.NumRows, TypeDesc.NumColumns);
    }

    TypeDesc.SetTypeName(Compiler.get_name(TypeID));
    if (TypeDesc.TypeName == nullptr || TypeDesc.TypeName[0] == '\0')
        TypeDesc.SetTypeName(Compiler.get_name(SpvType.parent_type));
    if (TypeDesc.TypeName == nullptr || TypeDesc.TypeName[0] == '\0')
        TypeDesc.SetDefaultTypeName(IsHLSLSource ? SHADER_SOURCE_LANGUAGE_HLSL : SHADER_SOURCE_LANGUAGE_GLSL);

    TypeDesc.ArraySize = !SpvType.array.empty() ? SpvType.array[0] : 0;

    for (uint32_t i = 0; i < SpvType.member_types.size(); ++i)
    {
        ShaderCodeVariableDesc VarDesc;
        VarDesc.Name = Compiler.get_member_name(TypeID, i).c_str();
        if (VarDesc.Name[0] == '\0')
            VarDesc.Name = Compiler.get_member_name(SpvType.parent_type, i).c_str();

        VarDesc.Offset = Compiler.type_struct_member_offset(SpvType, i);

        auto idx = TypeDesc.AddMember(VarDesc);
        VERIFY_EXPR(idx == i);
        LoadShaderCodeVariableDesc(Compiler, SpvType.member_types[i], Compiler.get_member_decoration_bitset(TypeID, i), IsHLSLSource, TypeDesc.GetMember(i));
    }
}